

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerConnection.cxx
# Opt level: O3

void __thiscall cmServerStdIoConnection::cmServerStdIoConnection(cmServerStdIoConnection *this)

{
  cmConnectionBufferStrategy *bufferStrategy;
  
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(0x28);
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmServerBufferStrategy_005ff4a8;
  bufferStrategy[1]._vptr_cmConnectionBufferStrategy = (_func_int **)(bufferStrategy + 3);
  bufferStrategy[2]._vptr_cmConnectionBufferStrategy = (_func_int **)0x0;
  *(undefined1 *)&bufferStrategy[3]._vptr_cmConnectionBufferStrategy = 0;
  cmEventBasedConnection::cmEventBasedConnection((cmEventBasedConnection *)this,bufferStrategy);
  (this->super_cmStdIoConnection).ReadStream.super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_cmStdIoConnection).ReadStream.super_uv_handle_ptr_base_<uv_stream_s>.handle.
  super___shared_ptr<uv_stream_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_cmStdIoConnection).super_cmEventBasedConnection.super_cmConnection._vptr_cmConnection
       = (_func_int **)&PTR_WriteData_005ff5a8;
  return;
}

Assistant:

cmServerStdIoConnection::cmServerStdIoConnection()
  : cmStdIoConnection(new cmServerBufferStrategy)
{
}